

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codim_mesh_data_set.h
# Opt level: O0

void __thiscall
lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::CodimMeshDataSet
          (CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this,
          shared_ptr<const_lf::mesh::Mesh> *mesh,dim_t codim)

{
  uint uVar1;
  element_type *peVar2;
  dim_t codim_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_local;
  CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this_local;
  
  (this->super_MeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>)._vptr_MeshDataSet =
       (_func_int **)0x0;
  MeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::MeshDataSet
            (&this->super_MeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>);
  (this->super_MeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>)._vptr_MeshDataSet =
       (_func_int **)&PTR_operator___00c8f670;
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(&this->mesh_,mesh);
  peVar2 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_);
  uVar1 = (*peVar2->_vptr_Mesh[3])(peVar2,(ulong)codim);
  boost::container::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_void,_void>::vector
            (&this->data_,(ulong)uVar1);
  this->codim_ = codim;
  return;
}

Assistant:

CodimMeshDataSet(std::shared_ptr<const Mesh> mesh, dim_t codim)
      : MeshDataSet<T>(),
        mesh_(std::move(mesh)),
        data_(mesh_->NumEntities(codim)),
        codim_(codim) {}